

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O1

int Aig_ObjCompareIdIncrease(Aig_Obj_t **pp1,Aig_Obj_t **pp2)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*pp2)->Id <= (*pp1)->Id) {
    uVar1 = (uint)((*pp1)->Id != (*pp2)->Id);
  }
  return uVar1;
}

Assistant:

int Aig_ObjCompareIdIncrease( Aig_Obj_t ** pp1, Aig_Obj_t ** pp2 )
{
    int Diff = Aig_ObjId(*pp1) - Aig_ObjId(*pp2);
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}